

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arranger.cpp
# Opt level: O0

void initialize_task_list
               (string *filename,string *download_address,curl_off_t file_size,
               download_status *status)

{
  bool bVar1;
  size_type sVar2;
  Task *this;
  size_type sVar3;
  proxy local_80;
  Task *local_50;
  Task *one_initial_task;
  proxy *single_proxy;
  iterator __end1;
  iterator __begin1;
  list<proxy,_std::allocator<proxy>_> *__range1;
  download_status *status_local;
  curl_off_t file_size_local;
  string *download_address_local;
  string *filename_local;
  
  sVar2 = std::__cxx11::list<proxy,_std::allocator<proxy>_>::size(&status->globalProxyList);
  if ((ulong)file_size <= sVar2 * 0x600000 && sVar2 * 0x600000 - file_size != 0) {
    fprintf(_stderr,"file size too small, please decrease proxies.");
    exit(-1);
  }
  __end1 = std::__cxx11::list<proxy,_std::allocator<proxy>_>::begin(&status->globalProxyList);
  single_proxy = (proxy *)std::__cxx11::list<proxy,_std::allocator<proxy>_>::end
                                    (&status->globalProxyList);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&single_proxy);
    if (!bVar1) break;
    one_initial_task = (Task *)std::_List_iterator<proxy>::operator*(&__end1);
    this = (Task *)operator_new(0x68);
    proxy::proxy(&local_80,(proxy *)one_initial_task);
    sVar2 = std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::size(&status->globalTaskList);
    sVar3 = std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::size(&status->globalTaskList);
    Task::Task(this,&local_80,sVar2 * 0x600000,sVar3 * 0x600000 + 0x600000);
    proxy::~proxy(&local_80);
    local_50 = this;
    std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::push_back
              (&status->globalTaskList,&local_50);
    Task::execute(local_50,filename,download_address,&status->taskMessageQueue);
    std::_List_iterator<proxy>::operator++(&__end1);
  }
  return;
}

Assistant:

void
initialize_task_list(const string &filename, const string &download_address, curl_off_t file_size, download_status *status) {
    if (TEST_DOWNLOAD_BYTES * status->globalProxyList.size() > file_size) {
        fprintf(stderr, "file size too small, please decrease proxies.");
        exit(-1);
    }
    for (const proxy &single_proxy:status->globalProxyList) {
        Task *one_initial_task = new Task(single_proxy, status->globalTaskList.size() * TEST_DOWNLOAD_BYTES,
                                          (status->globalTaskList.size() + 1) * TEST_DOWNLOAD_BYTES);
        status->globalTaskList.push_back(one_initial_task);
        one_initial_task->execute(filename, download_address, &status->taskMessageQueue);
    }
}